

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilBridge.c
# Opt level: O2

Gia_Man_t * Gia_ManFromBridgeReadBody(int Size,uchar *pBuffer,Vec_Int_t **pvInits)

{
  uchar *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Vec_Int_t *p;
  Gia_Man_t *p_00;
  char *pcVar6;
  Gia_Obj_t *pObj;
  ulong uVar7;
  Vec_Int_t *p_01;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  bool bVar12;
  uchar *pBuffer_local;
  uint local_5c;
  ulong local_58;
  ulong local_50;
  uchar *local_48;
  Vec_Int_t **local_40;
  Vec_Int_t *local_38;
  
  pBuffer_local = pBuffer;
  local_48 = pBuffer;
  local_40 = pvInits;
  uVar2 = Gia_AigerReadUnsigned(&pBuffer_local);
  uVar3 = Gia_AigerReadUnsigned(&pBuffer_local);
  uVar4 = Gia_AigerReadUnsigned(&pBuffer_local);
  p = Vec_IntAlloc(1000);
  Vec_IntPush(p,-999);
  Vec_IntPush(p,1);
  local_58 = (ulong)uVar3;
  p_00 = Gia_ManStart(uVar4 + uVar2 + uVar3 * 2 + 2);
  pcVar6 = (char *)malloc(5);
  builtin_strncpy(pcVar6,"temp",5);
  p_00->pName = pcVar6;
  uVar3 = 0;
  if (0 < (int)uVar2) {
    uVar3 = uVar2;
  }
  while (bVar12 = uVar3 != 0, uVar3 = uVar3 - 1, bVar12) {
    iVar5 = Gia_ManAppendCi(p_00);
    Vec_IntPush(p,iVar5);
  }
  uVar7 = 0;
  local_50 = uVar7;
  if (0 < (int)local_58) {
    uVar7 = local_58 & 0xffffffff;
    local_50 = uVar7;
  }
  while (iVar5 = (int)uVar7, uVar7 = (ulong)(iVar5 - 1), iVar5 != 0) {
    iVar5 = Gia_ManAppendCi(p_00);
    Vec_IntPush(p,iVar5);
  }
  local_48 = local_48 + Size;
  uVar3 = 0;
  local_38 = p;
  if (0 < (int)uVar4) {
    uVar3 = uVar4;
  }
  while( true ) {
    puVar1 = pBuffer_local;
    if (uVar3 == 0) {
      iVar5 = (int)local_50 + 1;
      do {
        uVar3 = Gia_AigerReadUnsigned(&pBuffer_local);
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
      uVar2 = 0;
      if (0 < (int)uVar3) {
        uVar2 = uVar3;
      }
      while( true ) {
        uVar3 = Gia_AigerReadUnsigned(&pBuffer_local);
        if (uVar2 == 0) break;
        iVar5 = Vec_IntEntry(p,uVar3 >> 1);
        uVar3 = Abc_LitNotCond(iVar5,uVar3 & 1);
        Gia_ManAppendCo(p_00,uVar3 ^ 1);
        uVar2 = uVar2 - 1;
      }
      if (uVar3 != 1) {
        __assert_fail("verFairness == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilBridge.c"
                      ,0x17b,
                      "Gia_Man_t *Gia_ManFromBridgeReadBody(int, unsigned char *, Vec_Int_t **)");
      }
      uVar3 = Gia_AigerReadUnsigned(&pBuffer_local);
      if (uVar3 != 0) {
        __assert_fail("nFairness == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilBridge.c"
                      ,0x17e,
                      "Gia_Man_t *Gia_ManFromBridgeReadBody(int, unsigned char *, Vec_Int_t **)");
      }
      uVar3 = Gia_AigerReadUnsigned(&pBuffer_local);
      if (uVar3 != 0) {
        __assert_fail("nConstraints == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilBridge.c"
                      ,0x181,
                      "Gia_Man_t *Gia_ManFromBridgeReadBody(int, unsigned char *, Vec_Int_t **)");
      }
      if (local_48 != pBuffer_local) {
        __assert_fail("pBufferEnd == pBuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilBridge.c"
                      ,0x184,
                      "Gia_Man_t *Gia_ManFromBridgeReadBody(int, unsigned char *, Vec_Int_t **)");
      }
      pBuffer_local = puVar1;
      p_01 = Vec_IntAlloc((int)local_58);
      while( true ) {
        iVar5 = (int)local_50;
        local_50 = (ulong)(iVar5 - 1);
        if (iVar5 == 0) {
          Gia_ManSetRegNum(p_00,(int)local_58);
          Vec_IntFree(p);
          if (local_40 == (Vec_Int_t **)0x0) {
            Vec_IntFree(p_01);
          }
          else {
            *local_40 = p_01;
          }
          return p_00;
        }
        uVar3 = Gia_AigerReadUnsigned(&pBuffer_local);
        if ((uVar3 & 3) != 2) break;
        Vec_IntPush(p_01,2);
        iVar5 = Vec_IntEntry(p,uVar3 >> 3);
        iVar5 = Abc_LitNotCond(iVar5,uVar3 >> 2 & 1);
        Gia_ManAppendCo(p_00,iVar5);
      }
      __assert_fail("(iFan0 & 3) == BRIDGE_VALUE_0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilBridge.c"
                    ,0x18c,
                    "Gia_Man_t *Gia_ManFromBridgeReadBody(int, unsigned char *, Vec_Int_t **)");
    }
    local_5c = uVar3 - 1;
    uVar3 = Gia_AigerReadUnsigned(&pBuffer_local);
    uVar2 = Gia_AigerReadUnsigned(&pBuffer_local);
    if ((uVar3 & 1) != 0) {
      __assert_fail("!(iFan0 & 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilBridge.c"
                    ,0x15c,
                    "Gia_Man_t *Gia_ManFromBridgeReadBody(int, unsigned char *, Vec_Int_t **)");
    }
    iVar5 = Vec_IntEntry(p,uVar3 >> 2);
    uVar3 = Abc_LitNotCond(iVar5,uVar3 >> 1 & 1);
    iVar5 = Vec_IntEntry(p,uVar2 >> 1);
    uVar2 = Abc_LitNotCond(iVar5,uVar2 & 1);
    pObj = Gia_ManAppendObj(p_00);
    uVar4 = uVar3 >> 1;
    if (p_00->nObjs <= (int)uVar4) {
      __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x2a8,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
    }
    uVar11 = uVar2 >> 1;
    if ((uint)p_00->nObjs <= uVar11) {
      __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x2a9,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
    }
    if ((uVar4 == uVar11) && (p_00->fGiaSimple == 0)) break;
    iVar5 = Gia_ObjId(p_00,pObj);
    uVar7 = (ulong)(iVar5 - uVar4 & 0x1fffffff);
    if (uVar3 < uVar2) {
      *(ulong *)pObj = (ulong)((uVar3 & 1) << 0x1d) | *(ulong *)pObj & 0xffffffffc0000000 | uVar7;
      iVar5 = Gia_ObjId(p_00,pObj);
      uVar7 = (ulong)(iVar5 - uVar11 & 0x1fffffff) << 0x20;
      uVar8 = *(ulong *)pObj & 0xc0000000ffffffff;
      uVar10 = (ulong)(uVar2 & 1) << 0x3d;
    }
    else {
      *(ulong *)pObj =
           (ulong)(uVar3 & 1) << 0x3d | *(ulong *)pObj & 0xc0000000ffffffff | uVar7 << 0x20;
      iVar5 = Gia_ObjId(p_00,pObj);
      uVar7 = (ulong)(iVar5 - uVar11 & 0x1fffffff);
      uVar8 = *(ulong *)pObj & 0xffffffffc0000000;
      uVar10 = (ulong)((uVar2 & 1) << 0x1d);
    }
    p = local_38;
    uVar3 = local_5c;
    uVar7 = uVar10 | uVar8 | uVar7;
    *(ulong *)pObj = uVar7;
    if (p_00->pFanData != (int *)0x0) {
      Gia_ObjAddFanout(p_00,pObj + -(uVar7 & 0x1fffffff),pObj);
      Gia_ObjAddFanout(p_00,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff),pObj);
    }
    if (p_00->fSweeper != 0) {
      uVar8 = *(ulong *)pObj & 0x1fffffff;
      uVar7 = *(ulong *)pObj >> 0x20 & 0x1fffffff;
      uVar10 = 0x4000000000000000;
      if (((uint)*(ulong *)(pObj + -uVar8) >> 0x1e & 1) == 0) {
        uVar10 = 0x40000000;
      }
      *(ulong *)(pObj + -uVar8) = uVar10 | *(ulong *)(pObj + -uVar8);
      uVar10 = *(ulong *)(pObj + -uVar7);
      uVar9 = 0x4000000000000000;
      if (((uint)uVar10 >> 0x1e & 1) == 0) {
        uVar9 = 0x40000000;
      }
      *(ulong *)(pObj + -uVar7) = uVar9 | uVar10;
      uVar7 = *(ulong *)pObj;
      *(ulong *)pObj =
           uVar7 & 0x7fffffffffffffff |
           (ulong)(((uint)(uVar7 >> 0x3d) ^ (uint)(uVar10 >> 0x3f)) &
                  ((uint)((ulong)*(undefined8 *)(pObj + -uVar8) >> 0x3f) ^ (uint)(uVar7 >> 0x1d) & 7
                  )) << 0x3f;
    }
    if (p_00->fBuiltInSim != 0) {
      uVar7 = *(ulong *)pObj;
      *(ulong *)pObj =
           uVar7 & 0x7fffffffffffffff |
           (ulong)(((uint)(uVar7 >> 0x3d) ^
                   (uint)((ulong)*(undefined8 *)(pObj + -(uVar7 >> 0x20 & 0x1fffffff)) >> 0x3f)) &
                  ((uint)((ulong)*(undefined8 *)(pObj + -(uVar7 & 0x1fffffff)) >> 0x3f) ^
                  (uint)(uVar7 >> 0x1d) & 7)) << 0x3f;
      iVar5 = Gia_ObjId(p_00,pObj);
      Gia_ManBuiltInSimPerform(p_00,iVar5);
    }
    if (p_00->vSuppWords != (Vec_Wrd_t *)0x0) {
      Gia_ManQuantSetSuppAnd(p_00,pObj);
    }
    iVar5 = Gia_ObjId(p_00,pObj);
    Vec_IntPush(p,iVar5 * 2);
  }
  __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x2aa,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
}

Assistant:

Gia_Man_t *  Gia_ManFromBridgeReadBody( int Size, unsigned char * pBuffer, Vec_Int_t ** pvInits )
{
    int fHash = 0;
    Vec_Int_t * vLits, * vInits;
    Gia_Man_t * p = NULL;
    unsigned char * pBufferPivot, * pBufferEnd = pBuffer + Size;
    int i, nInputs, nFlops, nGates, nProps;
    int verFairness, nFairness, nConstraints;
    unsigned iFan0, iFan1;

    nInputs = Gia_AigerReadUnsigned( &pBuffer );
    nFlops  = Gia_AigerReadUnsigned( &pBuffer );
    nGates  = Gia_AigerReadUnsigned( &pBuffer );

    vLits = Vec_IntAlloc( 1000 );
    Vec_IntPush( vLits, -999 );
    Vec_IntPush( vLits,  1 );

    // start the AIG package
    p = Gia_ManStart( nInputs + nFlops * 2 + nGates + 1 + 1 ); // PI+FO+FI+AND+PO+1
    p->pName = Abc_UtilStrsav( "temp" );

    // create PIs
    for ( i = 0; i < nInputs; i++ )
        Vec_IntPush( vLits, Gia_ManAppendCi( p ) );

    // create flop outputs
    for ( i = 0; i < nFlops; i++ )
        Vec_IntPush( vLits, Gia_ManAppendCi( p ) );

    // create nodes
    if ( fHash )
        Gia_ManHashAlloc( p );
    for ( i = 0; i < nGates; i++ )
    {
        iFan0 = Gia_AigerReadUnsigned( &pBuffer );
        iFan1 = Gia_AigerReadUnsigned( &pBuffer );
        assert( !(iFan0 & 1) );
        iFan0 >>= 1;
        iFan0 = Abc_LitNotCond( Vec_IntEntry(vLits, iFan0 >> 1), iFan0 & 1 );
        iFan1 = Abc_LitNotCond( Vec_IntEntry(vLits, iFan1 >> 1), iFan1 & 1 );
        if ( fHash )
            Vec_IntPush( vLits, Gia_ManHashAnd(p, iFan0, iFan1) );
        else
            Vec_IntPush( vLits, Gia_ManAppendAnd(p, iFan0, iFan1) );

    }
    if ( fHash )
        Gia_ManHashStop( p );

    // remember where flops begin
    pBufferPivot = pBuffer;
    // scroll through flops
    for ( i = 0; i < nFlops; i++ )
        Gia_AigerReadUnsigned( &pBuffer );

    // create POs
    nProps = Gia_AigerReadUnsigned( &pBuffer );
//    assert( nProps == 1 );
    for ( i = 0; i < nProps; i++ )
    {
        iFan0 = Gia_AigerReadUnsigned( &pBuffer );
        iFan0 = Abc_LitNotCond( Vec_IntEntry(vLits, iFan0 >> 1), iFan0 & 1 );
        // complement property output!!!
        Gia_ManAppendCo( p, Abc_LitNot(iFan0) );
    }

    verFairness = Gia_AigerReadUnsigned( &pBuffer );
    assert( verFairness == 1 );

    nFairness = Gia_AigerReadUnsigned( &pBuffer );
    assert( nFairness == 0 );

    nConstraints = Gia_AigerReadUnsigned( &pBuffer );
    assert( nConstraints == 0);

    // make sure the end of buffer is reached
    assert( pBufferEnd == pBuffer );

    // resetting to flops
    pBuffer = pBufferPivot;
    vInits = Vec_IntAlloc( nFlops );
    for ( i = 0; i < nFlops; i++ )
    {
        iFan0 = Gia_AigerReadUnsigned( &pBuffer );
        assert( (iFan0 & 3) == BRIDGE_VALUE_0 );
        Vec_IntPush( vInits, iFan0 & 3 ); // 0 = X value; 1 = not used; 2 = false; 3 = true
        iFan0 >>= 2;
        iFan0 = Abc_LitNotCond( Vec_IntEntry(vLits, iFan0 >> 1), iFan0 & 1 );
        Gia_ManAppendCo( p, iFan0 );
    }
    Gia_ManSetRegNum( p, nFlops );
    Vec_IntFree( vLits );

    // remove wholes in the node list
    if ( fHash )
    {
        Gia_Man_t * pTemp;
        p = Gia_ManCleanup( pTemp = p );
        Gia_ManStop( pTemp );
    }

    // return
    if ( pvInits )
        *pvInits = vInits;
    else
        Vec_IntFree( vInits );
    return p;
}